

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

CURLcode base64_encode(char *table64,Curl_easy *data,char *inputbuff,size_t insize,char **outptr,
                      size_t *outlen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *__s;
  size_t sVar4;
  char *local_78;
  char *indata;
  char *convbuf;
  char *base64data;
  char *output;
  int local_50;
  int inputparts;
  int i;
  undefined1 uStack_44;
  uchar obuf [4];
  uchar ibuf [3];
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  size_t insize_local;
  char *inputbuff_local;
  Curl_easy *data_local;
  char *table64_local;
  
  *outptr = (char *)0x0;
  *outlen = 0;
  unique0x1000017f = outlen;
  outptr_local = (char **)insize;
  if (insize == 0) {
    outptr_local = (char **)strlen(inputbuff);
  }
  __s = (char *)(*Curl_cmalloc)((ulong)((long)outptr_local << 2) / 3 + 4);
  if (__s == (char *)0x0) {
    table64_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    _uStack_44 = 0;
    local_78 = inputbuff;
    base64data = __s;
    while (outptr_local != (char **)0x0) {
      output._4_4_ = 0;
      for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
        if (outptr_local == (char **)0x0) {
          *(undefined1 *)((long)&i + (long)local_50 + 1) = 0;
        }
        else {
          output._4_4_ = output._4_4_ + 1;
          *(char *)((long)&i + (long)local_50 + 1) = *local_78;
          local_78 = local_78 + 1;
          outptr_local = (char **)((long)outptr_local + -1);
        }
      }
      bVar1 = i._1_1_ >> 2;
      bVar2 = (i._1_1_ & 3) << 4 | i._2_1_ >> 4;
      bVar3 = (i._3_1_ >> 6) + (i._2_1_ & 0xf) * '\x04';
      i._0_1_ = i._3_1_ & 0x3f;
      if (output._4_4_ == 1) {
        curl_msnprintf(base64data,5,"%c%c==",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2]);
      }
      else if (output._4_4_ == 2) {
        curl_msnprintf(base64data,5,"%c%c%c=",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2],(ulong)(uint)(int)table64[bVar3]);
      }
      else {
        curl_msnprintf(base64data,5,"%c%c%c%c",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2],(ulong)(uint)(int)table64[bVar3],
                       (int)table64[(byte)i]);
      }
      base64data = base64data + 4;
    }
    *base64data = '\0';
    *outptr = __s;
    (*Curl_cfree)((void *)0x0);
    sVar4 = strlen(__s);
    *stack0xffffffffffffffc0 = sVar4;
    table64_local._4_4_ = CURLE_OK;
  }
  return table64_local._4_4_;
}

Assistant:

static char *
base64_encode(const char *s, size_t len)
{
	static const char digits[64] =
	    { 'A','B','C','D','E','F','G','H','I','J','K','L','M','N','O',
	      'P','Q','R','S','T','U','V','W','X','Y','Z','a','b','c','d',
	      'e','f','g','h','i','j','k','l','m','n','o','p','q','r','s',
	      't','u','v','w','x','y','z','0','1','2','3','4','5','6','7',
	      '8','9','+','/' };
	int v;
	char *d, *out;

	/* 3 bytes becomes 4 chars, but round up and allow for trailing NUL */
	out = (char *)malloc((len * 4 + 2) / 3 + 1);
	if (out == NULL)
		return (NULL);
	d = out;

	/* Convert each group of 3 bytes into 4 characters. */
	while (len >= 3) {
		v = (((int)s[0] << 16) & 0xff0000)
		    | (((int)s[1] << 8) & 0xff00)
		    | (((int)s[2]) & 0x00ff);
		s += 3;
		len -= 3;
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		*d++ = digits[(v >> 6) & 0x3f];
		*d++ = digits[(v) & 0x3f];
	}
	/* Handle final group of 1 byte (2 chars) or 2 bytes (3 chars). */
	switch (len) {
	case 0: break;
	case 1:
		v = (((int)s[0] << 16) & 0xff0000);
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		break;
	case 2:
		v = (((int)s[0] << 16) & 0xff0000)
		    | (((int)s[1] << 8) & 0xff00);
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		*d++ = digits[(v >> 6) & 0x3f];
		break;
	}
	/* Add trailing NUL character so output is a valid C string. */
	*d = '\0';
	return (out);
}